

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O0

void __thiscall QWidgetLineControl::setValidator(QWidgetLineControl *this,QValidator *v)

{
  QPointer<QValidator> *in_RSI;
  QValidator *in_stack_ffffffffffffffe8;
  
  QPointer<QValidator>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void setValidator(const QValidator *v) { m_validator = const_cast<QValidator*>(v); }